

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O3

Curl_dns_entry * fetch_addr(connectdata *conn,char *hostname,int port)

{
  long lVar1;
  long lVar2;
  char *__s;
  size_t sVar3;
  Curl_dns_entry *pCVar4;
  hostcache_prune_data *data;
  Curl_dns_entry *c;
  hostcache_prune_data user;
  long local_30;
  
  __s = create_hostcache_id(hostname,port);
  if (__s == (char *)0x0) {
    pCVar4 = (Curl_dns_entry *)0x0;
  }
  else {
    sVar3 = strlen(__s);
    pCVar4 = (Curl_dns_entry *)
             Curl_hash_pick(*(curl_hash **)(conn->ip_addr_str + 0x10),__s,sVar3 + 1);
    if (pCVar4 == (Curl_dns_entry *)0x0) {
      pCVar4 = (Curl_dns_entry *)0x0;
    }
    else {
      lVar1._0_1_ = conn[1].readchannel_inuse;
      lVar1._1_1_ = conn[1].writechannel_inuse;
      lVar1._2_6_ = *(undefined6 *)&conn[1].field_0x462;
      if (lVar1 != -1) {
        time(&local_30);
        lVar2._0_1_ = conn[1].readchannel_inuse;
        lVar2._1_1_ = conn[1].writechannel_inuse;
        lVar2._2_6_ = *(undefined6 *)&conn[1].field_0x462;
        if ((pCVar4->timestamp != 0) && (lVar2 <= local_30 - pCVar4->timestamp)) {
          pCVar4 = (Curl_dns_entry *)0x0;
          Curl_infof((Curl_easy *)conn,"Hostname in DNS cache was stale, zapped\n");
          Curl_hash_delete(*(curl_hash **)(conn->ip_addr_str + 0x10),__s,sVar3 + 1);
        }
      }
    }
    (*Curl_cfree)(__s);
  }
  return pCVar4;
}

Assistant:

static struct Curl_dns_entry *
fetch_addr(struct connectdata *conn,
                const char *hostname,
                int port)
{
  char *entry_id = NULL;
  struct Curl_dns_entry *dns = NULL;
  size_t entry_len;
  struct Curl_easy *data = conn->data;

  /* Create an entry id, based upon the hostname and port */
  entry_id = create_hostcache_id(hostname, port);
  /* If we can't create the entry id, fail */
  if(!entry_id)
    return dns;

  entry_len = strlen(entry_id);

  /* See if its already in our dns cache */
  dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len + 1);

  if(dns && (data->set.dns_cache_timeout != -1)) {
    /* See whether the returned entry is stale. Done before we release lock */
    struct hostcache_prune_data user;

    time(&user.now);
    user.cache_timeout = data->set.dns_cache_timeout;

    if(hostcache_timestamp_remove(&user, dns)) {
      infof(data, "Hostname in DNS cache was stale, zapped\n");
      dns = NULL; /* the memory deallocation is being handled by the hash */
      Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);
    }
  }

  /* free the allocated entry_id again */
  free(entry_id);

  return dns;
}